

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase466::run(TestCase466 *this)

{
  __pid_t _Var1;
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *pFVar2;
  __pid_t local_108;
  int local_104;
  bool local_fd;
  __pid_t local_fc;
  int iStack_f8;
  bool _kj_shouldLog_1;
  bool local_f1;
  undefined1 local_f0 [7];
  bool _kj_shouldLog;
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> releaseFork;
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> local_d8;
  undefined1 local_c8 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:480:40),_kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>
  branch2;
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> local_b0;
  undefined1 local_a0 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:476:40),_kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>
  branch1;
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> fork;
  undefined1 local_78 [8];
  Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> promise;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase466 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  evalLater<kj::(anonymous_namespace)::TestCase466::run()::__0>
            ((kj *)local_78,(Type *)((long)&fork.hub.ptr + 7));
  Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::fork
            ((Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)
             &branch1.super_PromiseBase.node.ptr);
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::addBranch(&local_b0);
  Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>>::
  then<kj::(anonymous_namespace)::TestCase466::run()::__1,kj::_::PropagateException>
            ((Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>> *)local_a0,
             (Type *)&local_b0,(PropagateException *)((long)&branch2.super_PromiseBase.node.ptr + 7)
            );
  Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::~Promise
            ((Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)&local_b0);
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::addBranch(&local_d8);
  Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>>::
  then<kj::(anonymous_namespace)::TestCase466::run()::__2,kj::_::PropagateException>
            ((Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>> *)local_c8,
             (Type *)&local_d8,(PropagateException *)((long)&releaseFork.hub.ptr + 7));
  Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::~Promise
            ((Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)&local_d8);
  pFVar2 = mv<kj::ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>>>
                     ((ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)
                      &branch1.super_PromiseBase.node.ptr);
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::ForkedPromise
            ((ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)local_f0,pFVar2);
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::~ForkedPromise
            ((ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)local_f0);
  _Var1 = Promise<int>::wait((Promise<int> *)local_a0,local_58);
  if (_Var1 != 0x1c8) {
    local_f1 = _::Debug::shouldLog(ERROR);
    while (local_f1 != false) {
      iStack_f8 = 0x1c8;
      local_fc = Promise<int>::wait((Promise<int> *)local_a0,local_58);
      _::Debug::log<char_const(&)[52],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1e9,ERROR,
                 "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", 456, branch1.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
                 &stack0xffffffffffffff08,&local_fc);
      local_f1 = false;
    }
  }
  _Var1 = Promise<int>::wait((Promise<int> *)local_c8,local_58);
  if (_Var1 != 0x315) {
    local_fd = _::Debug::shouldLog(ERROR);
    while (local_fd != false) {
      local_104 = 0x315;
      local_108 = Promise<int>::wait((Promise<int> *)local_c8,local_58);
      _::Debug::log<char_const(&)[52],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1ea,ERROR,
                 "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", 789, branch2.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",&local_104,
                 &local_108);
      local_fd = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)local_c8);
  Promise<int>::~Promise((Promise<int> *)local_a0);
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::~ForkedPromise
            ((ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)
             &branch1.super_PromiseBase.node.ptr);
  Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::~Promise
            ((Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)local_78);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, ForkRef) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Own<RefcountedInt>> promise = evalLater([&]() {
    return refcounted<RefcountedInt>(123);
  });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](Own<RefcountedInt>&& i) {
    EXPECT_EQ(123, i->i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](Own<RefcountedInt>&& i) {
    EXPECT_EQ(123, i->i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}